

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testCaseStarting(XmlReporter *this,TestCaseInfo *testInfo)

{
  XmlFormatting fmt;
  int iVar1;
  XmlWriter *pXVar2;
  element_type *peVar3;
  string local_108;
  allocator local_e1;
  string local_e0;
  allocator local_b9;
  string local_b8;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  TestCaseInfo *local_18;
  TestCaseInfo *testInfo_local;
  XmlReporter *this_local;
  
  local_18 = testInfo;
  testInfo_local = (TestCaseInfo *)this;
  StreamingReporterBase<Catch::XmlReporter>::testCaseStarting
            (&this->super_StreamingReporterBase<Catch::XmlReporter>,testInfo);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"TestCase",&local_39);
  fmt = Catch::operator|(Newline,Indent);
  pXVar2 = XmlWriter::startElement(&this->m_xml,&local_38,fmt);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"name",&local_71);
  trim(&local_98,&local_18->name);
  pXVar2 = XmlWriter::writeAttribute(pXVar2,&local_70,&local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"description",&local_b9);
  pXVar2 = XmlWriter::writeAttribute(pXVar2,&local_b8,&local_18->description);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"tags",&local_e1);
  TestCaseInfo::tagsAsString_abi_cxx11_(&local_108,local_18);
  XmlWriter::writeAttribute(pXVar2,&local_e0,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  writeSourceInfo(this,&local_18->lineInfo);
  peVar3 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&(this->super_StreamingReporterBase<Catch::XmlReporter>).m_config);
  iVar1 = (*(peVar3->super_NonCopyable)._vptr_NonCopyable[0xb])();
  if (iVar1 == 1) {
    Timer::start(&this->m_testCaseTimer);
  }
  XmlWriter::ensureTagClosed(&this->m_xml);
  return;
}

Assistant:

void XmlReporter::testCaseStarting( TestCaseInfo const& testInfo ) {
        StreamingReporterBase::testCaseStarting(testInfo);
        m_xml.startElement( "TestCase" )
            .writeAttribute( "name", trim( testInfo.name ) )
            .writeAttribute( "description", testInfo.description )
            .writeAttribute( "tags", testInfo.tagsAsString() );

        writeSourceInfo( testInfo.lineInfo );

        if ( m_config->showDurations() == ShowDurations::Always )
            m_testCaseTimer.start();
        m_xml.ensureTagClosed();
    }